

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O3

ExprBase * EvaluateBinaryOp(ExpressionEvalContext *ctx,ExprBinaryOp *expression)

{
  uint uVar1;
  Allocator *pAVar2;
  SynBase *pSVar3;
  TypeBase *pTVar4;
  int iVar5;
  undefined4 extraout_var;
  ExprBase *pEVar6;
  
  uVar1 = (ctx->stackFrames).count;
  if ((uVar1 == 0) || ((ctx->stackFrames).data[uVar1 - 1]->targetYield == 0)) {
    if (ctx->instruction < ctx->instructionsLimit) {
      ctx->instruction = ctx->instruction + 1;
      pEVar6 = Evaluate(ctx,expression->lhs);
      if (pEVar6 != (ExprBase *)0x0) {
        pEVar6 = CreateBinaryOp(ctx,(expression->super_ExprBase).source,pEVar6,expression->rhs,
                                *(SynBinaryOpType *)&(expression->super_ExprBase).field_0x2c);
        if (pEVar6 != (ExprBase *)0x0) {
          pEVar6 = CheckType(&expression->super_ExprBase,pEVar6);
          return pEVar6;
        }
      }
      pEVar6 = (ExprBase *)0x0;
    }
    else {
      pEVar6 = (ExprBase *)0x0;
      Report(ctx,"ERROR: instruction limit reached");
    }
  }
  else {
    pAVar2 = ctx->ctx->allocator;
    iVar5 = (*pAVar2->_vptr_Allocator[2])(pAVar2,0x30);
    pEVar6 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar3 = (expression->super_ExprBase).source;
    pTVar4 = ctx->ctx->typeVoid;
    pEVar6->typeID = 2;
    pEVar6->source = pSVar3;
    pEVar6->type = pTVar4;
    pEVar6->next = (ExprBase *)0x0;
    pEVar6->listed = false;
    pEVar6->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6b38;
  }
  return pEVar6;
}

Assistant:

ExprBase* EvaluateBinaryOp(ExpressionEvalContext &ctx, ExprBinaryOp *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *lhs = Evaluate(ctx, expression->lhs);

	if(!lhs)
		return NULL;

	// rhs remain unevaluated
	ExprBase *result = CreateBinaryOp(ctx, expression->source, lhs, expression->rhs, expression->op);

	if(!result)
		return result;

	return CheckType(expression, result);
}